

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O0

UserData AllocUserData(void)

{
  UserData paVar1;
  realtype **pprVar2;
  sunindextype *psVar3;
  realtype *prVar4;
  UserData data;
  int jy;
  int jx;
  
  paVar1 = (UserData)malloc(0x478);
  for (data._4_4_ = 0; data._4_4_ < 8; data._4_4_ = data._4_4_ + 1) {
    for (data._0_4_ = 0; (int)data < 8; data._0_4_ = (int)data + 1) {
      pprVar2 = (realtype **)newDenseMat(6);
      paVar1->P[data._4_4_][(int)data] = pprVar2;
      psVar3 = (sunindextype *)newIndexArray(6);
      paVar1->pivot[data._4_4_][(int)data] = psVar3;
    }
  }
  pprVar2 = (realtype **)newDenseMat(6);
  paVar1->acoef = pprVar2;
  prVar4 = (realtype *)malloc(0x30);
  paVar1->bcoef = prVar4;
  prVar4 = (realtype *)malloc(0x30);
  paVar1->cox = prVar4;
  prVar4 = (realtype *)malloc(0x30);
  paVar1->coy = prVar4;
  return paVar1;
}

Assistant:

static UserData AllocUserData(void)
{
  int jx, jy;
  UserData data;

  data = (UserData) malloc(sizeof *data);
  
  for (jx=0; jx < MX; jx++) {
    for (jy=0; jy < MY; jy++) {
      (data->P)[jx][jy] = newDenseMat(NUM_SPECIES, NUM_SPECIES);
      (data->pivot)[jx][jy] = newIndexArray(NUM_SPECIES);
    }
  }

  acoef = newDenseMat(NUM_SPECIES, NUM_SPECIES);
  bcoef = (realtype *)malloc(NUM_SPECIES * sizeof(realtype));
  cox   = (realtype *)malloc(NUM_SPECIES * sizeof(realtype));
  coy   = (realtype *)malloc(NUM_SPECIES * sizeof(realtype));
  
  return(data);
}